

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blech32.c
# Opt level: O3

int wally_confidential_addr_segwit_to_ec_public_key
              (char *address,char *confidential_addr_family,uchar *bytes_out,size_t len)

{
  int iVar1;
  int iVar2;
  int witver;
  size_t written;
  uchar buf [1000];
  int local_404;
  size_t local_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  uchar local_3d8;
  
  local_404 = 0;
  local_400 = 0;
  iVar2 = -2;
  if ((((len == 0x21) && (confidential_addr_family != (char *)0x0)) && (address != (char *)0x0)) &&
     (bytes_out != (uchar *)0x0)) {
    iVar1 = blech32_addr_decode(&local_404,(uint8_t *)&local_3f8,&local_400,confidential_addr_family
                                ,address);
    iVar2 = -2;
    if (((iVar1 != 0) && (local_404 == 0)) && ((local_400 == 0x41 || (local_400 == 0x35)))) {
      bytes_out[0x20] = local_3d8;
      *(undefined8 *)(bytes_out + 0x10) = local_3e8;
      *(undefined8 *)(bytes_out + 0x18) = uStack_3e0;
      *(undefined8 *)bytes_out = local_3f8;
      *(undefined8 *)(bytes_out + 8) = uStack_3f0;
      iVar2 = 0;
    }
    wally_clear(&local_3f8,1000);
  }
  return iVar2;
}

Assistant:

int wally_confidential_addr_segwit_to_ec_public_key(
    const char *address,
    const char *confidential_addr_family,
    unsigned char *bytes_out,
    size_t len)
{
    unsigned char buf[WALLY_BLECH32_MAXLEN];
    int witver = 0;
    size_t written = 0;
    int ret = WALLY_OK;

    if (!address || !bytes_out || !confidential_addr_family || len != EC_PUBLIC_KEY_LEN)
        return WALLY_EINVAL;

    /* Only v0 witness programs are currently allowed */
    if (!blech32_addr_decode(&witver, buf, &written, confidential_addr_family, address))
        ret = WALLY_EINVAL;
    else if (witver != 0 || (written != 53 && written != 65))
        ret = WALLY_EINVAL;
    else
        memcpy(bytes_out, buf, EC_PUBLIC_KEY_LEN);

    wally_clear(buf, sizeof(buf));
    return ret;
}